

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quark.c
# Opt level: O0

qrk_t * qrk_new(void)

{
  qrk_t *size_00;
  leaf_s **pplVar1;
  qrk_t *qrk;
  uint64_t size;
  size_t in_stack_fffffffffffffff0;
  
  size_00 = (qrk_t *)xmalloc(in_stack_fffffffffffffff0);
  size_00->root = (node_s *)0x0;
  size_00->count = 0;
  size_00->lock = false;
  size_00->size = 0x80;
  pplVar1 = (leaf_s **)xmalloc((size_t)size_00);
  size_00->leafs = pplVar1;
  return size_00;
}

Assistant:

qrk_t *qrk_new(void) {
	const uint64_t size = 128;
	qrk_t *qrk = xmalloc(sizeof(qrk_t));
	qrk->root  = NULL;
	qrk->count = 0;
	qrk->lock  = false;
	qrk->size  = size;
	qrk->leafs = xmalloc(sizeof(leaf_t *) * size);
	return qrk;
}